

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,CodeLocation *code_location)

{
  Message *pMVar1;
  ostream *poVar2;
  int line;
  GTestLog local_64;
  Message errors;
  char *test_case_name_local;
  string local_50;
  string local_30;
  
  test_case_name_local = test_case_name;
  Message::Message(&errors);
  std::operator<<((ostream *)((long)errors.ss_.ptr_ + 0x10),"Attempted redefinition of test case ");
  pMVar1 = Message::operator<<(&errors,&test_case_name_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [3])0x122a27);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [64])
                                      "All tests in the same test case must use the same test fixture\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [31])"class.  However, in test case ");
  pMVar1 = Message::operator<<(pMVar1,&test_case_name_local);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [13])", you tried\n");
  pMVar1 = Message::operator<<(pMVar1,(char (*) [63])
                                      "to define a test using a fixture class different from the one\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "used earlier. This can happen if the two fixture classes are\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [62])
                                      "from different namespaces and have the same name. You should\n"
                              );
  pMVar1 = Message::operator<<(pMVar1,(char (*) [68])
                                      "probably rename one of the classes to put the tests into different\n"
                              );
  Message::operator<<(pMVar1,(char (*) [12])0x12273c);
  line = 0xa38;
  GTestLog::GTestLog(&local_64,GTEST_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/GridTools[P]cpp_bindgen/build_O2/_deps/googletest-src/googletest/src/gtest.cc"
                     ,0xa38);
  FormatFileLocation_abi_cxx11_
            (&local_30,(internal *)(code_location->file)._M_dataplus._M_p,
             (char *)(ulong)(uint)code_location->line,line);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_30);
  poVar2 = std::operator<<(poVar2," ");
  StringStreamToString(&local_50,(stringstream *)errors.ss_.ptr_);
  std::operator<<(poVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  GTestLog::~GTestLog(&local_64);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&errors.ss_);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               CodeLocation code_location) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  GTEST_LOG_(ERROR) << FormatFileLocation(code_location.file.c_str(),
                                          code_location.line)
                    << " " << errors.GetString();
}